

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Context> minja::Context::builtins(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<minja::Context> sVar1;
  anon_class_1_0_00000001 select_or_reject_attr;
  anon_class_1_1_50aec549 select_or_reject;
  anon_class_1_0_00000001 make_filter;
  Value equalto;
  Value escape;
  anon_class_1_0_00000001 char_transform_function;
  Value globals;
  shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>_>
  *in_stack_ffffffffffffd7c8;
  Value *in_stack_ffffffffffffd7d0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffd7d8;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
  *in_stack_ffffffffffffd7e0;
  Value *in_stack_ffffffffffffd7f8;
  allocator<char> *in_stack_ffffffffffffd800;
  char *in_stack_ffffffffffffd808;
  undefined7 in_stack_ffffffffffffd810;
  undefined1 in_stack_ffffffffffffd817;
  anon_class_1_0_00000001 *in_stack_ffffffffffffd818;
  char *in_stack_ffffffffffffd838;
  Value *in_stack_ffffffffffffd840;
  Value *in_stack_ffffffffffffd880;
  Value *in_stack_ffffffffffffd888;
  Value *in_stack_ffffffffffffd890;
  function<char_(char)> *in_stack_ffffffffffffd8d8;
  string *in_stack_ffffffffffffd8e0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffd8e8;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>
  *in_stack_ffffffffffffd8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd900;
  string *in_stack_ffffffffffffd908;
  string *local_2548;
  string *local_24e0;
  string *local_24a0;
  string *local_2460;
  string *local_2420;
  string *local_23e0;
  string *local_23a0;
  string *local_2360;
  string *local_2308;
  string *local_22b8;
  string *local_2278;
  string *local_2238;
  string *local_21f8;
  string *local_2190;
  string *local_2150;
  string *local_2110;
  string *local_20d0;
  string *local_2080;
  allocator<char> local_1e03;
  allocator<char> local_1e02;
  allocator<char> local_1e01;
  string *local_1e00;
  string local_1df8 [32];
  undefined1 local_1dd8 [32];
  undefined1 local_1db8 [32];
  string *local_1d98;
  undefined8 local_1d90;
  allocator<char> local_1d69;
  string local_1d68 [758];
  undefined1 local_1a72;
  allocator<char> local_1a71;
  string *local_1a70;
  string local_1a68 [32];
  string *local_1a48;
  undefined8 local_1a40;
  allocator<char> local_1a19;
  string local_1a18 [238];
  undefined1 local_192a;
  allocator<char> local_1929;
  string *local_1928;
  string local_1920 [32];
  string *local_1900;
  undefined8 local_18f8;
  allocator<char> local_18d1;
  string local_18d0 [238];
  undefined1 local_17e2;
  allocator<char> local_17e1;
  string *local_17e0;
  string local_17d8 [32];
  string *local_17b8;
  undefined8 local_17b0;
  allocator<char> local_1789;
  string local_1788 [238];
  undefined1 local_169a;
  allocator<char> local_1699;
  string *local_1698;
  string local_1690 [32];
  string *local_1670;
  undefined8 local_1668;
  allocator<char> local_1641;
  string local_1640 [238];
  undefined1 local_1552;
  allocator<char> local_1551;
  string *local_1550;
  string local_1548 [32];
  string *local_1528;
  undefined8 local_1520;
  allocator<char> local_14f9;
  string local_14f8 [238];
  undefined1 local_140a;
  allocator<char> local_1409;
  string *local_1408;
  string local_1400 [32];
  string *local_13e0;
  undefined8 local_13d8;
  allocator<char> local_13b1;
  string local_13b0 [397];
  undefined1 local_1223;
  allocator<char> local_1222;
  allocator<char> local_1221;
  string *local_1220;
  string local_1218 [32];
  undefined1 local_11f8 [32];
  string *local_11d8;
  undefined8 local_11d0;
  allocator<char> local_11a9;
  string local_11a8 [357];
  undefined1 local_1043;
  allocator<char> local_1042;
  allocator<char> local_1041;
  string *local_1040;
  string local_1038 [32];
  undefined1 local_1018 [32];
  string *local_ff8;
  undefined8 local_ff0;
  allocator<char> local_fc9;
  string local_fc8 [238];
  undefined1 local_eda;
  allocator<char> local_ed9;
  string *local_ed8;
  string local_ed0 [32];
  string *local_eb0;
  undefined8 local_ea8;
  allocator<char> local_e81;
  string local_e80 [238];
  undefined1 local_d92;
  allocator<char> local_d91;
  string *local_d90;
  string local_d88 [32];
  string *local_d68;
  undefined8 local_d60;
  allocator<char> local_d39;
  string local_d38 [238];
  undefined1 local_c4a;
  allocator<char> local_c49;
  string *local_c48;
  string local_c40 [32];
  string *local_c20;
  undefined8 local_c18;
  allocator<char> local_bf1;
  string local_bf0 [398];
  undefined1 local_a62;
  allocator<char> local_a61;
  string *local_a60;
  string local_a58 [32];
  string *local_a38;
  undefined8 local_a30;
  allocator<char> local_a09;
  string local_a08 [351];
  allocator<char> local_8a9;
  string local_8a8 [231];
  allocator<char> local_7c1;
  string local_7c0 [238];
  undefined1 local_6d2;
  allocator<char> local_6d1;
  string *local_6d0;
  string local_6c8 [32];
  string *local_6a8;
  undefined8 local_6a0;
  allocator<char> local_679;
  string local_678 [238];
  undefined1 local_58a;
  allocator<char> local_589;
  string *local_588;
  string local_580 [32];
  string *local_560;
  undefined8 local_558;
  allocator<char> local_531;
  string local_530 [238];
  undefined1 local_442;
  allocator<char> local_441;
  string *local_440;
  string local_438 [32];
  string *local_418;
  undefined8 local_410;
  allocator<char> local_3e9;
  string local_3e8 [237];
  undefined1 local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  string *local_2f8;
  string local_2f0 [32];
  undefined1 local_2d0 [32];
  string *local_2b0;
  undefined8 local_2a8;
  allocator<char> local_281;
  string local_280 [238];
  undefined1 local_192;
  allocator<char> local_191;
  string *local_190;
  string local_188 [32];
  string *local_168;
  undefined8 local_160;
  allocator<char> local_139;
  string local_138 [312];
  
  std::
  make_shared<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,minja::Value,std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::allocator<std::pair<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const,minja::Value>>>>
            ();
  Value::object(in_stack_ffffffffffffd7c8);
  std::
  shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>_>
  ::~shared_ptr((shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>_>
                 *)0x28de6b);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_192 = 1;
  local_190 = local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_192 = 0;
  local_168 = local_188;
  local_160 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28df40);
  __l._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l._M_array = (iterator)in_stack_ffffffffffffd808;
  __l._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_1_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28dfe4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28dffe);
  local_2080 = (string *)&local_168;
  do {
    local_2080 = local_2080 + -0x20;
    std::__cxx11::string::~string(local_2080);
  } while (local_2080 != local_188);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_2fb = 1;
  local_2f8 = local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_2f8 = (string *)local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_2fb = 0;
  local_2b0 = local_2f0;
  local_2a8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28e1a4);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_00._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_00,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_2_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28e248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28e262);
  local_20d0 = (string *)&local_2b0;
  do {
    local_20d0 = local_20d0 + -0x20;
    std::__cxx11::string::~string(local_20d0);
  } while (local_20d0 != local_2f0);
  std::allocator<char>::~allocator(&local_2fa);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_442 = 1;
  local_440 = local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_442 = 0;
  local_418 = local_438;
  local_410 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28e3ca);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_01._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_01,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_3_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28e46e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28e488);
  local_2110 = (string *)&local_418;
  do {
    local_2110 = local_2110 + -0x20;
    std::__cxx11::string::~string(local_2110);
  } while (local_2110 != local_438);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_58a = 1;
  local_588 = local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_58a = 0;
  local_560 = local_580;
  local_558 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28e5e3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_02._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_02,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_4_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28e687);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28e6a1);
  local_2150 = (string *)&local_560;
  do {
    local_2150 = local_2150 + -0x20;
    std::__cxx11::string::~string(local_2150);
  } while (local_2150 != local_580);
  std::allocator<char>::~allocator(&local_589);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_6d2 = 1;
  local_6d0 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_6d2 = 0;
  local_6a8 = local_6c8;
  local_6a0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28e7fc);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_03._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_03,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_5_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28e8a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28e8ba);
  local_2190 = (string *)&local_6a8;
  do {
    local_2190 = local_2190 + -0x20;
    std::__cxx11::string::~string(local_2190);
  } while (local_2190 != local_6c8);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_679);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  std::function<char(char)>::function<int(&)(int)noexcept,void>
            ((function<char_(char)> *)in_stack_ffffffffffffd7e0,
             (_func_int_int *)in_stack_ffffffffffffd7d8);
  builtins::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8d8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<char_(char)>::~function((function<char_(char)> *)0x28ea05);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  std::function<char(char)>::function<int(&)(int)noexcept,void>
            ((function<char_(char)> *)in_stack_ffffffffffffd7e0,
             (_func_int_int *)in_stack_ffffffffffffd7d8);
  builtins::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0,in_stack_ffffffffffffd8d8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<char_(char)>::~function((function<char_(char)> *)0x28eaf1);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_1_,void>
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  Value::callable((CallableType *)in_stack_ffffffffffffd7f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x28eb9b);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_a62 = 1;
  local_a60 = local_a58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_a62 = 0;
  local_a38 = local_a58;
  local_a30 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28ec67);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_04._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_04,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_6_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28ecdf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28ecf9);
  local_21f8 = (string *)&local_a38;
  do {
    local_21f8 = local_21f8 + -0x20;
    std::__cxx11::string::~string(local_21f8);
  } while (local_21f8 != local_a58);
  std::allocator<char>::~allocator(&local_a61);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator(&local_a09);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_c4a = 1;
  local_c48 = local_c40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_c4a = 0;
  local_c20 = local_c40;
  local_c18 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28eecb);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_05._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_05,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_7_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28ef6f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28ef89);
  local_2238 = (string *)&local_c20;
  do {
    local_2238 = local_2238 + -0x20;
    std::__cxx11::string::~string(local_2238);
  } while (local_2238 != local_c40);
  std::allocator<char>::~allocator(&local_c49);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_d92 = 1;
  local_d90 = local_d88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_d92 = 0;
  local_d68 = local_d88;
  local_d60 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28f0e4);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_06._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_06,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_8_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28f188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28f1a2);
  local_2278 = (string *)&local_d68;
  do {
    local_2278 = local_2278 + -0x20;
    std::__cxx11::string::~string(local_2278);
  } while (local_2278 != local_d88);
  std::allocator<char>::~allocator(&local_d91);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator(&local_d39);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_eda = 1;
  local_ed8 = local_ed0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_eda = 0;
  local_eb0 = local_ed0;
  local_ea8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28f2fd);
  __l_07._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_07._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_07._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_07,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_9_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28f3a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28f3bb);
  local_22b8 = (string *)&local_eb0;
  do {
    local_22b8 = local_22b8 + -0x20;
    std::__cxx11::string::~string(local_22b8);
  } while (local_22b8 != local_ed0);
  std::allocator<char>::~allocator(&local_ed9);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator(&local_e81);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1043 = 1;
  local_1040 = local_1038;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1040 = (string *)local_1018;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1043 = 0;
  local_ff8 = local_1038;
  local_ff0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28f561);
  __l_08._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_08._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_08._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_08,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_10_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28f605);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28f61f);
  local_2308 = (string *)&local_ff8;
  do {
    local_2308 = local_2308 + -0x20;
    std::__cxx11::string::~string(local_2308);
  } while (local_2308 != local_1038);
  std::allocator<char>::~allocator(&local_1042);
  std::allocator<char>::~allocator(&local_1041);
  std::__cxx11::string::~string(local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_2_,void>
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  Value::callable((CallableType *)in_stack_ffffffffffffd7f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x28f735);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1223 = 1;
  local_1220 = local_1218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1220 = (string *)local_11f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1223 = 0;
  local_11d8 = local_1218;
  local_11d0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28f84c);
  __l_09._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_09._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_09._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_09,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_11_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28f8c4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28f8de);
  local_2360 = (string *)&local_11d8;
  do {
    local_2360 = local_2360 + -0x20;
    std::__cxx11::string::~string(local_2360);
  } while (local_2360 != local_1218);
  std::allocator<char>::~allocator(&local_1222);
  std::allocator<char>::~allocator(&local_1221);
  std::__cxx11::string::~string(local_11a8);
  std::allocator<char>::~allocator(&local_11a9);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_140a = 1;
  local_1408 = local_1400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_140a = 0;
  local_13e0 = local_1400;
  local_13d8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28fabd);
  __l_10._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_10._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_10._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_10,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_12_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28fb61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28fb7b);
  local_23a0 = (string *)&local_13e0;
  do {
    local_23a0 = local_23a0 + -0x20;
    std::__cxx11::string::~string(local_23a0);
  } while (local_23a0 != local_1400);
  std::allocator<char>::~allocator(&local_1409);
  std::__cxx11::string::~string(local_13b0);
  std::allocator<char>::~allocator(&local_13b1);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1552 = 1;
  local_1550 = local_1548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1552 = 0;
  local_1528 = local_1548;
  local_1520 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28fcd6);
  __l_11._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_11._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_11._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_11,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_13_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28fd7a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28fd94);
  local_23e0 = (string *)&local_1528;
  do {
    local_23e0 = local_23e0 + -0x20;
    std::__cxx11::string::~string(local_23e0);
  } while (local_23e0 != local_1548);
  std::allocator<char>::~allocator(&local_1551);
  std::__cxx11::string::~string(local_14f8);
  std::allocator<char>::~allocator(&local_14f9);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_169a = 1;
  local_1698 = local_1690;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_169a = 0;
  local_1670 = local_1690;
  local_1668 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x28feef);
  __l_12._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_12._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_12._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_12,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_14_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x28ff93);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x28ffad);
  local_2420 = (string *)&local_1670;
  do {
    local_2420 = local_2420 + -0x20;
    std::__cxx11::string::~string(local_2420);
  } while (local_2420 != local_1690);
  std::allocator<char>::~allocator(&local_1699);
  std::__cxx11::string::~string(local_1640);
  std::allocator<char>::~allocator(&local_1641);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_17e2 = 1;
  local_17e0 = local_17d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_17e2 = 0;
  local_17b8 = local_17d8;
  local_17b0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x290108);
  __l_13._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_13._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_13._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_13,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_15_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x2901ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2901c6);
  local_2460 = (string *)&local_17b8;
  do {
    local_2460 = local_2460 + -0x20;
    std::__cxx11::string::~string(local_2460);
  } while (local_2460 != local_17d8);
  std::allocator<char>::~allocator(&local_17e1);
  std::__cxx11::string::~string(local_1788);
  std::allocator<char>::~allocator(&local_1789);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_192a = 1;
  local_1928 = local_1920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_192a = 0;
  local_1900 = local_1920;
  local_18f8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x290321);
  __l_14._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_14._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_14._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_14,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_16_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x2903c5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2903df);
  local_24a0 = (string *)&local_1900;
  do {
    local_24a0 = local_24a0 + -0x20;
    std::__cxx11::string::~string(local_24a0);
  } while (local_24a0 != local_1920);
  std::allocator<char>::~allocator(&local_1929);
  std::__cxx11::string::~string(local_18d0);
  std::allocator<char>::~allocator(&local_18d1);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1a72 = 1;
  local_1a70 = local_1a68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1a72 = 0;
  local_1a48 = local_1a68;
  local_1a40 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x29053a);
  __l_15._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_15._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_15._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_15,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_17_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x2905de);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2905f8);
  local_24e0 = (string *)&local_1a48;
  do {
    local_24e0 = local_24e0 + -0x20;
    std::__cxx11::string::~string(local_24e0);
  } while (local_24e0 != local_1a68);
  std::allocator<char>::~allocator(&local_1a71);
  std::__cxx11::string::~string(local_1a18);
  std::allocator<char>::~allocator(&local_1a19);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  builtins::anon_class_1_1_50aec549::operator()
            ((anon_class_1_1_50aec549 *)in_stack_ffffffffffffd818,(bool)in_stack_ffffffffffffd817);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  builtins::anon_class_1_1_50aec549::operator()
            ((anon_class_1_1_50aec549 *)in_stack_ffffffffffffd818,(bool)in_stack_ffffffffffffd817);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_3_,void>
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  Value::callable((CallableType *)in_stack_ffffffffffffd7f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x2907d4);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1e00 = local_1df8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1e00 = (string *)local_1dd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1e00 = (string *)local_1db8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffd817,in_stack_ffffffffffffd810),in_stack_ffffffffffffd808
             ,in_stack_ffffffffffffd800);
  local_1d98 = local_1df8;
  local_1d90 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x29094c);
  __l_16._M_len._0_7_ = in_stack_ffffffffffffd810;
  __l_16._M_array = (iterator)in_stack_ffffffffffffd808;
  __l_16._M_len._7_1_ = in_stack_ffffffffffffd817;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd800,__l_16,(allocator_type *)in_stack_ffffffffffffd7f8);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::Value&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::Value&)_18_,void>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  simple_function(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)>::~function
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::Value_&)> *)
             0x2909f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd7e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x290a0a);
  local_2548 = (string *)&local_1d98;
  do {
    local_2548 = local_2548 + -0x20;
    std::__cxx11::string::~string(local_2548);
  } while (local_2548 != local_1df8);
  std::allocator<char>::~allocator(&local_1e03);
  std::allocator<char>::~allocator(&local_1e02);
  std::allocator<char>::~allocator(&local_1e01);
  std::__cxx11::string::~string(local_1d68);
  std::allocator<char>::~allocator(&local_1d69);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  builtins::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffd818,(bool)in_stack_ffffffffffffd817);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  builtins::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffd818,(bool)in_stack_ffffffffffffd817);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::Value(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838);
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
  function<minja::Context::builtins()::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_4_,void>
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8);
  Value::callable((CallableType *)in_stack_ffffffffffffd7f8);
  Value::set(in_stack_ffffffffffffd890,in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x290c00);
  Value::~Value(in_stack_ffffffffffffd7d0);
  std::make_shared<minja::Context,minja::Value>(in_stack_ffffffffffffd7f8);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  Value::~Value(in_stack_ffffffffffffd7d0);
  sVar1.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Context>)
         sVar1.super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Context> Context::builtins() {
  auto globals = Value::object();

  globals.set("raise_exception", simple_function("raise_exception", { "message" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
    throw std::runtime_error(args.at("message").get<std::string>());
  }));
  globals.set("tojson", simple_function("tojson", { "value", "indent" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value(args.at("value").dump(args.get<int64_t>("indent", -1), /* to_json= */ true));
  }));
  globals.set("items", simple_function("items", { "object" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto items = Value::array();
    if (args.contains("object")) {
      auto & obj = args.at("object");
      if (obj.is_string()) {
        auto json_obj = json::parse(obj.get<std::string>());
        for (const auto & kv : json_obj.items()) {
          items.push_back(Value::array({kv.key(), kv.value()}));
        }
      } else if (!obj.is_null()) {
        for (auto & key : obj.keys()) {
          items.push_back(Value::array({key, obj.at(key)}));
        }
      }
    }
    return items;
  }));
  globals.set("last", simple_function("last", { "items" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto items = args.at("items");
    if (!items.is_array()) throw std::runtime_error("object is not a list");
    if (items.empty()) return Value();
    return items.at(items.size() - 1);
  }));
  globals.set("trim", simple_function("trim", { "text" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto & text = args.at("text");
    return text.is_null() ? text : Value(strip(text.get<std::string>()));
  }));
  auto char_transform_function = [](const std::string & name, const std::function<char(char)> & fn) {
    return simple_function(name, { "text" }, [=](const std::shared_ptr<Context> &, Value & args) {
      auto text = args.at("text");
      if (text.is_null()) return text;
      std::string res;
      auto str = text.get<std::string>();
      std::transform(str.begin(), str.end(), std::back_inserter(res), fn);
      return Value(res);
    });
  };
  globals.set("lower", char_transform_function("lower", ::tolower));
  globals.set("upper", char_transform_function("upper", ::toupper));
  globals.set("default", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    args.expectArgs("default", {2, 3}, {0, 1});
    auto & value = args.args[0];
    auto & default_value = args.args[1];
    bool boolean = false;
    if (args.args.size() == 3) {
      boolean = args.args[2].get<bool>();
    } else {
      Value bv = args.get_named("boolean");
      if (!bv.is_null()) {
        boolean = bv.get<bool>();
      }
    }
    return boolean ? (value.to_bool() ? value : default_value) : value.is_null() ? default_value : value;
  }));
  auto escape = simple_function("escape", { "text" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value(html_escape(args.at("text").get<std::string>()));
  });
  globals.set("e", escape);
  globals.set("escape", escape);
  globals.set("joiner", simple_function("joiner", { "sep" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto sep = args.get<std::string>("sep", "");
    auto first = std::make_shared<bool>(true);
    return simple_function("", {}, [sep, first](const std::shared_ptr<Context> &, const Value &) -> Value {
      if (*first) {
        *first = false;
        return "";
      }
      return sep;
    });
    return Value(html_escape(args.at("text").get<std::string>()));
  }));
  globals.set("count", simple_function("count", { "items" }, [](const std::shared_ptr<Context> &, Value & args) {
    return Value((int64_t) args.at("items").size());
  }));
  globals.set("dictsort", simple_function("dictsort", { "value" }, [](const std::shared_ptr<Context> &, Value & args) {
    if (args.size() != 1) throw std::runtime_error("dictsort expects exactly 1 argument (TODO: fix implementation)");
    auto & value = args.at("value");
    auto keys = value.keys();
    std::sort(keys.begin(), keys.end());
    auto res = Value::array();
    for (auto & key : keys) {
      res.push_back(Value::array({key, value.at(key)}));
    }
    return res;
  }));
  globals.set("join", simple_function("join", { "items", "d" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto do_join = [](Value & items, const std::string & sep) {
      if (!items.is_array()) throw std::runtime_error("object is not iterable: " + items.dump());
      std::ostringstream oss;
      auto first = true;
      for (size_t i = 0, n = items.size(); i < n; ++i) {
        if (first) first = false;
        else oss << sep;
        oss << items.at(i).to_str();
      }
      return Value(oss.str());
    };
    auto sep = args.get<std::string>("d", "");
    if (args.contains("items")) {
        auto & items = args.at("items");
        return do_join(items, sep);
    } else {
      return simple_function("", {"items"}, [sep, do_join](const std::shared_ptr<Context> &, Value & args) {
        auto & items = args.at("items");
        if (!items.to_bool() || !items.is_array()) throw std::runtime_error("join expects an array for items, got: " + items.dump());
        return do_join(items, sep);
      });
    }
  }));
  globals.set("namespace", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    auto ns = Value::object();
    args.expectArgs("namespace", {0, 0}, {0, (std::numeric_limits<size_t>::max)()});
    for (auto & [name, value] : args.kwargs) {
      ns.set(name, value);
    }
    return ns;
  }));
  auto equalto = simple_function("equalto", { "expected", "actual" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("actual") == args.at("expected");
  });
  globals.set("equalto", equalto);
  globals.set("==", equalto);
  globals.set("length", simple_function("length", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      return (int64_t) items.size();
  }));
  globals.set("safe", simple_function("safe", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_str();
  }));
  globals.set("string", simple_function("string", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_str();
  }));
  globals.set("int", simple_function("int", { "value" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      return args.at("value").to_int();
  }));
  globals.set("list", simple_function("list", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      if (!items.is_array()) throw std::runtime_error("object is not iterable");
      return items;
  }));
  globals.set("unique", simple_function("unique", { "items" }, [](const std::shared_ptr<Context> &, Value & args) -> Value {
      auto & items = args.at("items");
      if (!items.is_array()) throw std::runtime_error("object is not iterable");
      std::unordered_set<Value> seen;
      auto result = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto pair = seen.insert(items.at(i));
        if (pair.second) {
          result.push_back(items.at(i));
        }
      }
      return result;
  }));
  auto make_filter = [](const Value & filter, Value & extra_args) -> Value {
    return simple_function("", { "value" }, [=](const std::shared_ptr<Context> & context, Value & args) {
      auto & value = args.at("value");
      ArgumentsValue actual_args;
      actual_args.args.emplace_back(value);
      for (size_t i = 0, n = extra_args.size(); i < n; i++) {
        actual_args.args.emplace_back(extra_args.at(i));
      }
      return filter.call(context, actual_args);
    });
  };
  auto select_or_reject = [make_filter](bool is_select) {
    return Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
      args.expectArgs(is_select ? "select" : "reject", {2, (std::numeric_limits<size_t>::max)()}, {0, 0});
      auto & items = args.args[0];
      if (items.is_null()) {
        return Value::array();
      }
      if (!items.is_array()) {
        throw std::runtime_error("object is not iterable: " + items.dump());
      }

      auto filter_fn = context->get(args.args[1]);
      if (filter_fn.is_null()) {
        throw std::runtime_error("Undefined filter: " + args.args[1].dump());
      }

      auto filter_args = Value::array();
      for (size_t i = 2, n = args.args.size(); i < n; i++) {
        filter_args.push_back(args.args[i]);
      }
      auto filter = make_filter(filter_fn, filter_args);

      auto res = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        ArgumentsValue filter_args;
        filter_args.args.emplace_back(item);
        auto pred_res = filter.call(context, filter_args);
        if (pred_res.to_bool() == (is_select ? true : false)) {
          res.push_back(item);
        }
      }
      return res;
    });
  };
  globals.set("select", select_or_reject(/* is_select= */ true));
  globals.set("reject", select_or_reject(/* is_select= */ false));
  globals.set("map", Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
    auto res = Value::array();
    if (args.args.size() == 1 &&
      ((args.has_named("attribute") && args.kwargs.size() == 1) || (args.has_named("default") && args.kwargs.size() == 2))) {
      auto & items = args.args[0];
      auto attr_name = args.get_named("attribute");
      auto default_value = args.get_named("default");
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        auto attr = item.get(attr_name);
        res.push_back(attr.is_null() ? default_value : attr);
      }
    } else if (args.kwargs.empty() && args.args.size() >= 2) {
      auto fn = context->get(args.args[1]);
      if (fn.is_null()) throw std::runtime_error("Undefined filter: " + args.args[1].dump());
      ArgumentsValue filter_args { {Value()}, {} };
      for (size_t i = 2, n = args.args.size(); i < n; i++) {
        filter_args.args.emplace_back(args.args[i]);
      }
      for (size_t i = 0, n = args.args[0].size(); i < n; i++) {
        auto & item = args.args[0].at(i);
        filter_args.args[0] = item;
        res.push_back(fn.call(context, filter_args));
      }
    } else {
      throw std::runtime_error("Invalid or unsupported arguments for map");
    }
    return res;
  }));
  globals.set("indent", simple_function("indent", { "text", "indent", "first" }, [](const std::shared_ptr<Context> &, Value & args) {
    auto text = args.at("text").get<std::string>();
    auto first = args.get<bool>("first", false);
    std::string out;
    std::string indent(args.get<int64_t>("indent", 0), ' ');
    std::istringstream iss(text);
    std::string line;
    auto is_first = true;
    while (std::getline(iss, line, '\n')) {
      auto needs_indent = !is_first || first;
      if (is_first) is_first = false;
      else out += "\n";
      if (needs_indent) out += indent;
      out += line;
    }
    if (!text.empty() && text.back() == '\n') out += "\n";
    return out;
  }));
  auto select_or_reject_attr = [](bool is_select) {
    return Value::callable([=](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
      args.expectArgs(is_select ? "selectattr" : "rejectattr", {2, (std::numeric_limits<size_t>::max)()}, {0, 0});
      auto & items = args.args[0];
      if (items.is_null())
        return Value::array();
      if (!items.is_array()) throw std::runtime_error("object is not iterable: " + items.dump());
      auto attr_name = args.args[1].get<std::string>();

      bool has_test = false;
      Value test_fn;
      ArgumentsValue test_args {{Value()}, {}};
      if (args.args.size() >= 3) {
        has_test = true;
        test_fn = context->get(args.args[2]);
        if (test_fn.is_null()) throw std::runtime_error("Undefined test: " + args.args[2].dump());
        for (size_t i = 3, n = args.args.size(); i < n; i++) {
          test_args.args.emplace_back(args.args[i]);
        }
        test_args.kwargs = args.kwargs;
      }

      auto res = Value::array();
      for (size_t i = 0, n = items.size(); i < n; i++) {
        auto & item = items.at(i);
        auto attr = item.get(attr_name);
        if (has_test) {
          test_args.args[0] = attr;
          if (test_fn.call(context, test_args).to_bool() == (is_select ? true : false)) {
            res.push_back(item);
          }
        } else {
          res.push_back(attr);
        }
      }
      return res;
    });
  };
  globals.set("selectattr", select_or_reject_attr(/* is_select= */ true));
  globals.set("rejectattr", select_or_reject_attr(/* is_select= */ false));
  globals.set("range", Value::callable([=](const std::shared_ptr<Context> &, ArgumentsValue & args) {
    std::vector<int64_t> startEndStep(3);
    std::vector<bool> param_set(3);
    if (args.args.size() == 1) {
      startEndStep[1] = args.args[0].get<int64_t>();
      param_set[1] = true;
    } else {
      for (size_t i = 0; i < args.args.size(); i++) {
        auto & arg = args.args[i];
        auto v = arg.get<int64_t>();
        startEndStep[i] = v;
        param_set[i] = true;
      }
    }
    for (auto & [name, value] : args.kwargs) {
      size_t i;
      if (name == "start") {
        i = 0;
      } else if (name == "end") {
        i = 1;
      } else if (name == "step") {
        i = 2;
      } else {
        throw std::runtime_error("Unknown argument " + name + " for function range");
      }

      if (param_set[i]) {
        throw std::runtime_error("Duplicate argument " + name + " for function range");
      }
      startEndStep[i] = value.get<int64_t>();
      param_set[i] = true;
    }
    if (!param_set[1]) {
      throw std::runtime_error("Missing required argument 'end' for function range");
    }
    int64_t start = param_set[0] ? startEndStep[0] : 0;
    int64_t end = startEndStep[1];
    int64_t step = param_set[2] ? startEndStep[2] : 1;

    auto res = Value::array();
    if (step > 0) {
      for (int64_t i = start; i < end; i += step) {
        res.push_back(Value(i));
      }
    } else {
      for (int64_t i = start; i > end; i += step) {
        res.push_back(Value(i));
      }
    }
    return res;
  }));

  return std::make_shared<Context>(std::move(globals));
}